

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_main.c
# Opt level: O0

void free_config_fields(GlobalConfig *config)

{
  GlobalConfig *config_local;
  
  free(config->trace_dump);
  config->trace_dump = (char *)0x0;
  if (((config->errors_fopened & 1U) != 0) && (config->errors != (FILE *)0x0)) {
    fclose((FILE *)config->errors);
  }
  config->errors = (FILE *)0x0;
  if (((config->trace_fopened & 1U) != 0) && (config->trace_stream != (FILE *)0x0)) {
    fclose((FILE *)config->trace_stream);
  }
  config->trace_stream = (FILE *)0x0;
  free(config->libcurl);
  config->libcurl = (char *)0x0;
  return;
}

Assistant:

static void free_config_fields(struct GlobalConfig *config)
{
  Curl_safefree(config->trace_dump);

  if(config->errors_fopened && config->errors)
    fclose(config->errors);
  config->errors = NULL;

  if(config->trace_fopened && config->trace_stream)
    fclose(config->trace_stream);
  config->trace_stream = NULL;

  Curl_safefree(config->libcurl);
}